

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator local_38;
  TidyIterator local_20;
  size_t itemIndex;
  ctmbstr item;
  TidyIterator *iter_local;
  
  itemIndex = 0;
  if (iter != (TidyIterator *)0x0) {
    local_20 = *iter;
    if (local_20 != (TidyIterator)0x0) {
      uVar1 = tidyInstalledLanguageListSize();
      if (local_20 <= (TidyIterator)(ulong)uVar1) {
        itemIndex = (size_t)tidyLanguages.languages[(long)((long)&local_20[-1]._opaque + 3)]->
                            messages[0].value;
        local_20 = (TidyIterator)((long)&local_20->_opaque + 1);
      }
    }
    uVar1 = tidyInstalledLanguageListSize();
    if ((TidyIterator)(ulong)uVar1 < local_20) {
      local_38 = (TidyIterator)0x0;
    }
    else {
      local_38 = local_20;
    }
    *iter = local_38;
    return (ctmbstr)itemIndex;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/language.c"
                ,0x285,"ctmbstr prvTidygetNextInstalledLanguage(TidyIterator *)");
}

Assistant:

ctmbstr TY_(getNextInstalledLanguage)( TidyIterator* iter )
{
    ctmbstr item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyInstalledLanguageListSize() )
    {
        item = tidyLanguages.languages[itemIndex - 1]->messages[0].value;
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyInstalledLanguageListSize() ? itemIndex : (size_t)0 );
    return item;
}